

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall
capnp::LocalCallContext::tailCall(LocalCallContext *this,Own<capnp::RequestHook> *request)

{
  Own<capnp::RequestHook> *request_00;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *pPVar1;
  Own<capnp::PipelineHook> *hook;
  Promise<void> *pPVar2;
  Own<capnp::RequestHook> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar3;
  Pipeline local_80;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *local_48;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *f;
  VoidPromiseAndPipeline result;
  Own<capnp::RequestHook> *request_local;
  LocalCallContext *this_local;
  
  request_00 = kj::mv<kj::Own<capnp::RequestHook>>(in_RDX);
  directTailCall((VoidPromiseAndPipeline *)&f,(LocalCallContext *)request,request_00);
  local_48 = kj::_::readMaybe<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>>
                       ((Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>_> *)
                        &request[8].ptr);
  if (local_48 != (Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *)0x0) {
    pPVar1 = kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>::get(local_48);
    hook = kj::mv<kj::Own<capnp::PipelineHook>>
                     ((Own<capnp::PipelineHook> *)&result.promise.super_PromiseBase.node.ptr);
    AnyPointer::Pipeline::Pipeline(&local_80,hook);
    (**pPVar1->_vptr_PromiseFulfiller)(pPVar1,&local_80);
    AnyPointer::Pipeline::~Pipeline(&local_80);
  }
  pPVar2 = kj::mv<kj::Promise<void>>((Promise<void> *)&f);
  kj::Promise<void>::Promise((Promise<void> *)this,pPVar2);
  ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline((VoidPromiseAndPipeline *)&f);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> tailCall(kj::Own<RequestHook>&& request) override {
    auto result = directTailCall(kj::mv(request));
    KJ_IF_MAYBE(f, tailCallPipelineFulfiller) {
      f->get()->fulfill(AnyPointer::Pipeline(kj::mv(result.pipeline)));
    }
    return kj::mv(result.promise);
  }